

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

Builder * __thiscall
arangodb::velocypack::Builder::closeEmptyArrayOrObject(Builder *this,ValueLength pos,bool isArray)

{
  ValueLength *pVVar1;
  undefined3 in_register_00000011;
  
  this->_start[pos] = (CONCAT31(in_register_00000011,isArray) == 0) * '\t' + '\x01';
  this->_pos = this->_pos - 8;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 - 8;
  closeLevel(this);
  return this;
}

Assistant:

Builder& Builder::closeEmptyArrayOrObject(ValueLength pos, bool isArray) {
  // empty Array or Object
  _start[pos] = (isArray ? 0x01 : 0x0a);
  VELOCYPACK_ASSERT(_pos == pos + 9);
  rollback(8);  // no bytelength and number subvalues needed
  closeLevel();
  return *this;
}